

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O3

void run_centers_task(parallel_task_1d *task,size_t thread_id)

{
  ulong uVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 extraout_XMM0_Qb;
  float in_XMM1_Da;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  
  uVar5 = (task->range).begin;
  uVar1 = (task->range).end;
  if (uVar5 < uVar1) {
    lVar4 = uVar5 * 0xc + 8;
    do {
      uVar6 = (*task[1].work_item.work_fn)(task[1].work_item.next,uVar5);
      sVar2 = task[1].range.begin;
      *(undefined8 *)((sVar2 - 8) + lVar4) = uVar6;
      *(float *)(sVar2 + lVar4) = in_XMM1_Da;
      sVar2 = task[1].range.end;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(sVar2 + thread_id * 0x18);
      fVar8 = *(float *)(sVar2 + 8 + thread_id * 0x18);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(sVar2 + 0xc + thread_id * 0x18);
      fVar11 = *(float *)(sVar2 + 0x14 + thread_id * 0x18);
      auVar7._8_8_ = extraout_XMM0_Qb;
      auVar7._0_8_ = uVar6;
      auVar7 = minps(auVar10,auVar7);
      if (in_XMM1_Da <= fVar8) {
        fVar8 = in_XMM1_Da;
      }
      auVar3._8_8_ = extraout_XMM0_Qb;
      auVar3._0_8_ = uVar6;
      auVar10 = maxps(auVar9,auVar3);
      if (fVar11 <= in_XMM1_Da) {
        fVar11 = in_XMM1_Da;
      }
      *(long *)(sVar2 + thread_id * 0x18) = auVar7._0_8_;
      *(float *)(sVar2 + 8 + thread_id * 0x18) = fVar8;
      *(long *)(sVar2 + 0xc + thread_id * 0x18) = auVar10._0_8_;
      *(float *)(sVar2 + 0x14 + thread_id * 0x18) = fVar11;
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0xc;
    } while (uVar1 != uVar5);
  }
  return;
}

Assistant:

static void run_centers_task(struct parallel_task_1d* task, size_t thread_id) {
    struct centers_task* centers_task = (void*)task;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        struct vec3 center = centers_task->center_fn(centers_task->primitive_data, i);
        centers_task->centers[i] = center;
        centers_task->center_bboxes[thread_id] = extend_bbox(centers_task->center_bboxes[thread_id], center);
    }
}